

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cpp
# Opt level: O0

Sexp * AnalyzeSet(Sexp *form)

{
  bool bVar1;
  JetRuntimeException *pJVar2;
  Sexp *pSVar3;
  SetMeaning *this;
  Sexp **value;
  SetMeaning *meaning;
  Environment local_d8;
  size_t sym_name;
  size_t right_index;
  size_t up_index;
  string local_a8 [38];
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  tuple<bool&,unsigned_long&> local_60 [16];
  undefined1 local_50 [24];
  size_t len;
  Sexp *pSStack_30;
  bool is_proper;
  Sexp *binding;
  FrameProtector local_18;
  FrameProtector __frame_prot;
  Sexp *form_local;
  
  __frame_prot.protected_frame = (Frame *)form;
  FrameProtector::FrameProtector(&local_18,"AnalyzeSet");
  FrameProtector::ProtectValue(&local_18,(Sexp **)&__frame_prot,"form");
  pSStack_30 = (Sexp *)0x0;
  FrameProtector::ProtectValue(&local_18,&stack0xffffffffffffffd0,"binding");
  Sexp::Length((Sexp *)local_50);
  std::tie<bool,unsigned_long>((bool *)local_60,(unsigned_long *)((long)&len + 7));
  std::tuple<bool&,unsigned_long&>::operator=(local_60,(tuple<bool,_unsigned_long> *)local_50);
  if (((len._7_1_ & 1) != 0) && ((Sexp *)local_50._16_8_ == (Sexp *)0x2)) {
    pSVar3 = Sexp::Car((Sexp *)__frame_prot.protected_frame);
    bVar1 = Sexp::IsSymbol(pSVar3);
    if (!bVar1) {
      up_index._6_1_ = 1;
      pJVar2 = (JetRuntimeException *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a8,"invalid define form",(allocator *)((long)&up_index + 7));
      JetRuntimeException::JetRuntimeException(pJVar2,(string *)local_a8);
      up_index._6_1_ = 0;
      __cxa_throw(pJVar2,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
    }
    pSVar3 = Sexp::Car((Sexp *)__frame_prot.protected_frame);
    local_d8.slot_map.
    super__Vector_base<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pSVar3->field_1).cons.car;
    Environment::Get(&local_d8,(size_t)g_the_environment);
    std::tie<unsigned_long,unsigned_long>((unsigned_long *)&meaning,&right_index);
    std::tuple<unsigned_long&,unsigned_long&>::operator=
              ((tuple<unsigned_long&,unsigned_long&> *)&meaning,
               (tuple<unsigned_long,_unsigned_long> *)&local_d8);
    pSVar3 = Sexp::Cadr((Sexp *)__frame_prot.protected_frame);
    pSStack_30 = Analyze(pSVar3);
    this = (SetMeaning *)operator_new(0x20);
    SetMeaning::SetMeaning(this,right_index,sym_name,pSStack_30);
    value = SetMeaning::BindingValue(this);
    FrameProtector::ProtectValue(&local_18,value,"meaning->BindingValue()");
    pSVar3 = GcHeap::AllocateMeaning((Meaning *)this);
    FrameProtector::~FrameProtector(&local_18);
    return pSVar3;
  }
  local_82 = 1;
  pJVar2 = (JetRuntimeException *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"invalid set! form",&local_81);
  JetRuntimeException::JetRuntimeException(pJVar2,(string *)local_80);
  local_82 = 0;
  __cxa_throw(pJVar2,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
}

Assistant:

static Sexp *AnalyzeSet(Sexp *form) {
  GC_HELPER_FRAME;
  GC_PROTECT(form);
  GC_PROTECTED_LOCAL(binding);

  bool is_proper;
  size_t len;
  std::tie(is_proper, len) = form->Length();
  if (!is_proper || len != 2) {
    throw JetRuntimeException("invalid set! form");
  }

  if (!form->Car()->IsSymbol()) {
    throw JetRuntimeException("invalid define form");
  }

  size_t up_index;
  size_t right_index;
  size_t sym_name = form->Car()->symbol_value;
  std::tie(up_index, right_index) = g_the_environment->Get(sym_name);
  binding = Analyze(form->Cadr());
  SetMeaning *meaning = new SetMeaning(up_index, right_index, binding);
  GC_PROTECT(meaning->BindingValue());
  return GcHeap::AllocateMeaning(meaning);
}